

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdfjob-c.cc
# Opt level: O1

int qpdfjob_run_from_json(char *json)

{
  int iVar1;
  _Any_data local_28;
  code *local_18;
  code *pcStack_10;
  
  local_28._8_8_ = 0;
  pcStack_10 = std::
               _Function_handler<int_(_qpdfjob_handle_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdfjob-c.cc:153:9)>
               ::_M_invoke;
  local_18 = std::
             _Function_handler<int_(_qpdfjob_handle_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdfjob-c.cc:153:9)>
             ::_M_manager;
  local_28._M_unused._0_8_ = (undefined8)json;
  iVar1 = run_with_handle((function<int_(_qpdfjob_handle_*)> *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return iVar1;
}

Assistant:

int
qpdfjob_run_from_json(char const* json)
{
    return run_with_handle(
        [json](qpdfjob_handle j) { return qpdfjob_initialize_from_json(j, json); });
}